

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_spt(CPUS390XState_conflict *env,uint64_t time)

{
  int64_t iVar1;
  
  if (time != 0xffffffffffffffff) {
    iVar1 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
    env->cputm = iVar1 + (time >> 9) * 0x7d + (ulong)(((uint)time & 0x1ff) * 0x7d >> 9);
  }
  return;
}

Assistant:

void HELPER(spt)(CPUS390XState *env, uint64_t time)
{
    if (time == -1ULL) {
        return;
    }

    /* nanoseconds */
    time = tod2time(time);

    env->cputm = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL) + time;

    // timer_mod(env->cpu_timer, env->cputm);
}